

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

bool __thiscall CoreML::NeuralNetworkShaper::isValid(NeuralNetworkShaper *this)

{
  bool bVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  _Self __tmp;
  
  p_Var3 = (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((bVar1 = (_Rb_tree_header *)p_Var3 ==
                  &(this->blobShapes)._M_t._M_impl.super__Rb_tree_header, !bVar1 &&
         (bVar2 = ShapeConstraint::isValid((ShapeConstraint *)(p_Var3 + 2)), bVar2))) {
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  }
  return bVar1;
}

Assistant:

bool NeuralNetworkShaper::isValid() const {
    // TODO: make this check all of the blob names, and make it compare to the input and output shapes
    for (auto ind = blobShapes.begin(); ind != blobShapes.end(); ind++) {
        if (!(*ind).second.isValid())
            return false;
    }
    return true;
}